

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int trbudget_check(trbudget_t *budget,int size)

{
  int iVar1;
  
  iVar1 = budget->remain - size;
  if (budget->remain < size) {
    if (budget->chance == 0) {
      budget->count = budget->count + size;
      return 0;
    }
    budget->remain = iVar1 + budget->incval;
    budget->chance = budget->chance + -1;
  }
  else {
    budget->remain = iVar1;
  }
  return 1;
}

Assistant:

static INLINE
int
trbudget_check(trbudget_t *budget, int size) {
  if(size <= budget->remain) { budget->remain -= size; return 1; }
  if(budget->chance == 0) { budget->count += size; return 0; }
  budget->remain += budget->incval - size;
  budget->chance -= 1;
  return 1;
}